

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaders.cpp
# Opt level: O2

void gpu::uploadShaderSources<char_const*,char*>(u32 shader,char **xs,char **xs_1)

{
  i32 sizes [2];
  char *srcs [2];
  
  srcs[0] = *xs;
  srcs[1] = *xs_1;
  sizes[0] = tl::strlen<char>(srcs[0]);
  sizes[1] = tl::strlen<char>(*xs_1);
  (*glad_debug_glShaderSource)(shader,2,srcs,sizes);
  return;
}

Assistant:

void uploadShaderSources(u32 shader, const Ts&... xs)
{
    const char* const srcs[] = { xs... };
    const i32 sizes[] = { strlenGeneric(xs)... };
   glShaderSource(shader, sizeof...(xs), srcs, sizes);
}